

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::FieldNameCapitalized_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *field)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  FieldDescriptor *field_local;
  string *result;
  
  FieldName_abi_cxx11_(__return_storage_ptr__,this,field);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    cVar1 = ascii_toupper(*pcVar3);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar3 = cVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldNameCapitalized(const FieldDescriptor* field) {
  // Want the same suffix handling, so upcase the first letter of the other
  // name.
  string result = FieldName(field);
  if (result.length() > 0) {
    result[0] = ascii_toupper(result[0]);
  }
  return result;
}